

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O2

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint32_t i;
  long lVar15;
  ulong uVar16;
  uint ikmlen;
  uint32_t prklen;
  byte bVar17;
  uint8_t *puVar18;
  undefined8 uStack_3e0;
  uint8_t auStack_3d8 [6];
  undefined2 uStack_3d2;
  uint8_t auStack_3d0 [9];
  undefined2 uStack_3c7;
  undefined8 uStack_3c5;
  undefined2 uStack_3bd;
  uint8_t auStack_3bb [9];
  uint8_t auStack_3b2 [8];
  uint8_t auStack_3aa [8];
  uint8_t auStack_3a2 [8];
  undefined8 auStack_39a [5];
  uint8_t auStack_372 [8];
  uint8_t auStack_36a [8];
  uint8_t auStack_362 [8];
  uint8_t auStack_35a [8];
  uint8_t auStack_352 [8];
  uint8_t auStack_34a [8];
  uint8_t auStack_342 [10];
  uint8_t auStack_338 [6];
  undefined2 uStack_332;
  uint8_t auStack_330 [9];
  undefined2 uStack_327;
  uint8_t auStack_325 [4];
  uint8_t auStack_321 [8];
  uint8_t auStack_319 [8];
  uint8_t auStack_311 [8];
  uint8_t auStack_309 [8];
  undefined8 auStack_301 [5];
  uint8_t auStack_2d9 [8];
  uint8_t auStack_2d1 [8];
  uint8_t auStack_2c9 [8];
  uint8_t auStack_2c1 [8];
  uint8_t auStack_2b9 [8];
  uint8_t auStack_2b1 [8];
  uint8_t auStack_2a9 [9];
  undefined8 uStack_2a0;
  uint8_t auStack_298 [6];
  undefined2 uStack_292;
  uint8_t auStack_290 [9];
  undefined2 uStack_287;
  uint8_t auStack_285 [4];
  uint8_t auStack_281 [8];
  uint8_t auStack_279 [8];
  uint8_t auStack_271 [8];
  uint8_t auStack_269 [8];
  undefined1 auStack_261 [8];
  undefined1 auStack_259 [8];
  undefined1 auStack_251 [8];
  undefined1 auStack_249 [8];
  undefined1 auStack_241 [8];
  uint8_t auStack_239 [4];
  undefined8 uStack_235;
  undefined8 uStack_22d;
  undefined8 uStack_225;
  undefined8 local_21d;
  undefined8 uStack_215;
  undefined8 uStack_20d;
  undefined5 uStack_205;
  undefined3 uStack_200;
  undefined5 uStack_1fd;
  uint8_t local_1f8 [4];
  undefined2 local_1f4;
  uint8_t local_1f2 [9];
  undefined1 auStack_1e9 [4];
  undefined1 local_1e5 [5];
  undefined3 uStack_1e0;
  undefined5 uStack_1dd;
  undefined4 uStack_1d8;
  undefined2 uStack_1d4;
  uint8_t uStack_1d2;
  undefined4 uStack_1d1;
  undefined4 uStack_1cd;
  undefined2 uStack_1c9;
  undefined1 auStack_1c7 [8];
  undefined1 auStack_1bf [3];
  undefined4 uStack_1bc;
  undefined8 uStack_1b8;
  uint8_t o_info_hash [64];
  uint8_t o_eae_prk [32];
  undefined1 auStack_138 [8];
  uint8_t zeros [32];
  uint8_t auStack_f8 [8];
  uint8_t o_shared [32];
  undefined1 auStack_c8 [8];
  uint8_t o_dh [32];
  
  auStack_f8[0] = '\0';
  auStack_f8[1] = '\0';
  auStack_f8[2] = '\0';
  auStack_f8[3] = '\0';
  auStack_f8[4] = '\0';
  auStack_f8[5] = '\0';
  auStack_f8[6] = '\0';
  auStack_f8[7] = '\0';
  o_shared[0] = '\0';
  o_shared[1] = '\0';
  o_shared[2] = '\0';
  o_shared[3] = '\0';
  o_shared[4] = '\0';
  o_shared[5] = '\0';
  o_shared[6] = '\0';
  o_shared[7] = '\0';
  o_shared[8] = '\0';
  o_shared[9] = '\0';
  o_shared[10] = '\0';
  o_shared[0xb] = '\0';
  o_shared[0xc] = '\0';
  o_shared[0xd] = '\0';
  o_shared[0xe] = '\0';
  o_shared[0xf] = '\0';
  o_shared[0x10] = '\0';
  o_shared[0x11] = '\0';
  o_shared[0x12] = '\0';
  o_shared[0x13] = '\0';
  o_shared[0x14] = '\0';
  o_shared[0x15] = '\0';
  o_shared[0x16] = '\0';
  o_shared[0x17] = '\0';
  stack0xfffffffffffffe40 = 0x1af358;
  uStack_1bc = 0;
  Hacl_Curve25519_51_secret_to_public(o_pkE,skE);
  _auStack_138 = ZEXT1632(ZEXT816(0) << 0x40);
  stack0xfffffffffffffe40 = 0x1af37d;
  uStack_1bc = 0;
  _auStack_c8 = _auStack_138;
  Hacl_Curve25519_51_scalarmult(auStack_c8,skE,pkR);
  bVar17 = 0xff;
  for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 1) {
    stack0xfffffffffffffe40 = 0x1af3a0;
    uStack_1bc = 0;
    bVar12 = FStar_UInt8_eq_mask(auStack_c8[lVar15],auStack_138[lVar15]);
    bVar17 = bVar17 & bVar12;
  }
  if (bVar17 != 0xff) {
    uVar1 = *(undefined8 *)o_pkE;
    uVar2 = *(undefined8 *)(o_pkE + 8);
    uVar3 = *(undefined8 *)(o_pkE + 0x10);
    uVar4 = *(undefined8 *)(o_pkE + 0x18);
    uVar5 = *(undefined8 *)pkR;
    uVar6 = *(undefined8 *)(pkR + 8);
    uVar7 = *(undefined8 *)(pkR + 0x10);
    uVar8 = *(undefined8 *)(pkR + 0x18);
    register0x00001200 = ZEXT832(0) << 0x20;
    uStack_1b8 = CONCAT35(uStack_1b8._5_3_,0x20004d454b);
    builtin_memcpy(local_1f8,"HPKE",4);
    local_1f4 = 0x762d;
    local_1f2[0] = '1';
    local_1f2[1] = 'K';
    local_1f2[2] = 'E';
    local_1f2[3] = 'M';
    local_1f2[4] = '\0';
    local_1f2[5] = 0x20;
    stack0xfffffffffffffe14 = 0x5f656165;
    auStack_1e9._1_3_ = 0x6b7270;
    local_1e5 = auStack_c8._0_5_;
    uStack_1e0 = auStack_c8._5_3_;
    uStack_1dd = auStack_c8._8_5_;
    uStack_1d8 = auStack_c8._13_4_;
    uStack_1d4 = auStack_c8._17_2_;
    uStack_1d2 = auStack_c8[0x13];
    uStack_1d1 = auStack_c8._20_4_;
    uStack_1cd = auStack_c8._24_4_;
    uStack_1c9 = auStack_c8._28_2_;
    auStack_1c7._0_2_ = auStack_c8._30_2_;
    uStack_200 = 0x1af450;
    uStack_1fd = 0;
    Hacl_HKDF_extract_sha2_256(o_info_hash + 0x38,(uint8_t *)&uStack_1b8,0,local_1f8,0x33);
    auStack_259._1_2_ = 0x2000;
    auStack_259._3_4_ = 0x454b5048;
    stack0xfffffffffffffdae = 0x762d;
    auStack_251[1] = 0x31;
    auStack_251._2_4_ = (undefined4)uStack_1b8;
    auStack_251[6] = uStack_1b8._4_1_;
    stack0xfffffffffffffdb6 = 0x6572616873;
    auStack_249._4_3_ = 0x735f64;
    stack0xfffffffffffffdbe = 0x7465726365;
    uStack_205 = (undefined5)uVar8;
    uStack_200 = (undefined3)((ulong)uVar8 >> 0x28);
    stack0xfffffffffffffda0 = 0x1af4ce;
    unique0x100024c2 = uVar1;
    uStack_235 = uVar2;
    uStack_22d = uVar3;
    uStack_225 = uVar4;
    local_21d = uVar5;
    uStack_215 = uVar6;
    uStack_20d = uVar7;
    Hacl_HKDF_expand_sha2_256(auStack_f8,o_info_hash + 0x38,0x20,auStack_259 + 1,0x5b,0x20);
    builtin_memcpy(o_shared + 0x18,"HPKE",5);
    o_shared[0x1d] = ' ';
    o_shared[0x1e] = '\0';
    o_shared[0x1f] = '\x03';
    _auStack_138 = ZEXT1632(ZEXT816(0) << 0x40);
    register0x00001200 = ZEXT1632(ZEXT816(0) << 0x40);
    uStack_1d8 = 0x454b5048;
    uStack_1d4 = 0x762d;
    uStack_1d2 = '1';
    uStack_1d1 = 0x454b5048;
    uStack_1cd = 0x3002000;
    uStack_1c9 = 0x300;
    auStack_1c7._0_2_ = 0x7370;
    auStack_1c7._2_5_ = 0x5f64695f6b;
    stack0xfffffffffffffe40 = 0x68736168;
    uStack_1e0 = 0x1af56a;
    uStack_1dd = 0;
    unique0x100024fa = _auStack_138;
    Hacl_HKDF_extract_sha2_512(o_info_hash + 0x38,o_shared + 0x18,0,(uint8_t *)&uStack_1d8,0x1c);
    o_info_hash[0x18] = '\0';
    o_info_hash[0x19] = '\0';
    o_info_hash[0x1a] = '\0';
    o_info_hash[0x1b] = '\0';
    o_info_hash[0x1c] = '\0';
    o_info_hash[0x1d] = '\0';
    o_info_hash[0x1e] = '\0';
    o_info_hash[0x1f] = '\0';
    o_info_hash[0x20] = '\0';
    o_info_hash[0x21] = '\0';
    o_info_hash[0x22] = '\0';
    o_info_hash[0x23] = '\0';
    o_info_hash[0x24] = '\0';
    o_info_hash[0x25] = '\0';
    o_info_hash[0x26] = '\0';
    o_info_hash[0x27] = '\0';
    o_info_hash[0x28] = '\0';
    o_info_hash[0x29] = '\0';
    o_info_hash[0x2a] = '\0';
    o_info_hash[0x2b] = '\0';
    o_info_hash[0x2c] = '\0';
    o_info_hash[0x2d] = '\0';
    o_info_hash[0x2e] = '\0';
    o_info_hash[0x2f] = '\0';
    o_info_hash[0x30] = '\0';
    o_info_hash[0x31] = '\0';
    o_info_hash[0x32] = '\0';
    o_info_hash[0x33] = '\0';
    o_info_hash[0x34] = '\0';
    o_info_hash[0x35] = '\0';
    o_info_hash[0x36] = '\0';
    o_info_hash[0x37] = '\0';
    uStack_1b8 = 0;
    o_info_hash[0] = '\0';
    o_info_hash[1] = '\0';
    o_info_hash[2] = '\0';
    o_info_hash[3] = '\0';
    o_info_hash[4] = '\0';
    o_info_hash[5] = '\0';
    o_info_hash[6] = '\0';
    o_info_hash[7] = '\0';
    o_info_hash[8] = '\0';
    o_info_hash[9] = '\0';
    o_info_hash[10] = '\0';
    o_info_hash[0xb] = '\0';
    o_info_hash[0xc] = '\0';
    o_info_hash[0xd] = '\0';
    o_info_hash[0xe] = '\0';
    o_info_hash[0xf] = '\0';
    o_info_hash[0x10] = '\0';
    o_info_hash[0x11] = '\0';
    o_info_hash[0x12] = '\0';
    o_info_hash[0x13] = '\0';
    o_info_hash[0x14] = '\0';
    o_info_hash[0x15] = '\0';
    o_info_hash[0x16] = '\0';
    o_info_hash[0x17] = '\0';
    ikmlen = infolen + 0x1a;
    uVar16 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    lVar15 = -uVar16;
    puVar18 = (uint8_t *)((long)&uStack_1d8 + lVar15);
    *(undefined8 *)((long)&uStack_1e0 + lVar15) = 0x1af5a2;
    memset(puVar18,0,(ulong)ikmlen);
    builtin_memcpy((uint8_t *)((long)&uStack_1d8 + lVar15),"HPKE",4);
    *(undefined2 *)((long)&uStack_1d4 + lVar15) = 0x762d;
    (&uStack_1d2)[lVar15] = '1';
    *(undefined8 *)((long)&uStack_1d1 + lVar15) = o_shared._24_8_;
    *(undefined2 *)((long)&uStack_1c9 + lVar15) = 0x300;
    *(undefined8 *)(auStack_1c7 + lVar15) = 0x7361685f6f666e69;
    auStack_1bf[-uVar16] = 0x68;
    *(undefined8 *)((long)&uStack_1e0 + lVar15) = 0x1af5f0;
    memcpy(auStack_1bf + lVar15 + 1,info,(ulong)infolen);
    *(undefined8 *)((long)&uStack_1e0 + lVar15) = 0x1af60a;
    Hacl_HKDF_extract_sha2_512((uint8_t *)&uStack_1b8,o_shared + 0x18,0,puVar18,ikmlen);
    uVar5 = o_info_hash._48_8_;
    uVar4 = o_info_hash._40_8_;
    uVar3 = o_info_hash._32_8_;
    uVar6 = o_info_hash._56_8_;
    uVar7 = o_eae_prk._0_8_;
    uVar8 = o_eae_prk._8_8_;
    uVar9 = o_eae_prk._16_8_;
    o_dh[0] = o_info_hash[0];
    o_dh[1] = o_info_hash[1];
    o_dh[2] = o_info_hash[2];
    o_dh[3] = o_info_hash[3];
    o_dh[4] = o_info_hash[4];
    o_dh[5] = o_info_hash[5];
    o_dh[6] = o_info_hash[6];
    o_dh[7] = o_info_hash[7];
    auStack_c8 = (undefined1  [8])uStack_1b8;
    o_dh[8] = o_info_hash[8];
    o_dh[9] = o_info_hash[9];
    o_dh[10] = o_info_hash[10];
    o_dh[0xb] = o_info_hash[0xb];
    o_dh[0xc] = o_info_hash[0xc];
    o_dh[0xd] = o_info_hash[0xd];
    o_dh[0xe] = o_info_hash[0xe];
    o_dh[0xf] = o_info_hash[0xf];
    o_dh[0x10] = o_info_hash[0x10];
    o_dh[0x11] = o_info_hash[0x11];
    o_dh[0x12] = o_info_hash[0x12];
    o_dh[0x13] = o_info_hash[0x13];
    o_dh[0x14] = o_info_hash[0x14];
    o_dh[0x15] = o_info_hash[0x15];
    o_dh[0x16] = o_info_hash[0x16];
    o_dh[0x17] = o_info_hash[0x17];
    o_dh[0x18] = o_info_hash[0x18];
    o_dh[0x19] = o_info_hash[0x19];
    o_dh[0x1a] = o_info_hash[0x1a];
    o_dh[0x1b] = o_info_hash[0x1b];
    o_dh[0x1c] = o_info_hash[0x1c];
    o_dh[0x1d] = o_info_hash[0x1d];
    o_dh[0x1e] = o_info_hash[0x1e];
    o_dh[0x1f] = o_info_hash[0x1f];
    builtin_memcpy(local_1f8 + lVar15,"HPKE",4);
    *(undefined2 *)((long)&local_1f4 + lVar15) = 0x762d;
    local_1f2[lVar15] = '1';
    *(undefined8 *)(local_1f2 + lVar15 + 1) = o_shared._24_8_;
    *(undefined2 *)(auStack_1e9 + lVar15) = 0x300;
    *(undefined4 *)(auStack_1e9 + lVar15 + 2) = 0x72636573;
    *(undefined2 *)(local_1e5 + lVar15 + 2) = 0x7465;
    *(undefined8 *)((long)&uStack_200 + lVar15) = 0x17;
    uVar1 = *(undefined8 *)((long)&uStack_200 + lVar15);
    *(undefined8 *)((long)&uStack_200 + lVar15) = 0x20;
    uVar2 = *(undefined8 *)((long)&uStack_200 + lVar15);
    *(undefined8 *)((long)&uStack_200 + lVar15) = 0x1af6a2;
    Hacl_HKDF_extract_sha2_512
              (auStack_138,auStack_f8,(uint32_t)uVar2,local_1f8 + lVar15,(uint32_t)uVar1);
    (auStack_298 + lVar15)[0] = '\0';
    (auStack_298 + lVar15)[1] = '@';
    puVar18 = auStack_298 + lVar15 + 2;
    puVar18[0] = 'H';
    puVar18[1] = 'P';
    puVar18[2] = 'K';
    puVar18[3] = 'E';
    *(undefined2 *)((long)&uStack_292 + lVar15) = 0x762d;
    auStack_290[lVar15] = '1';
    *(undefined8 *)(auStack_290 + lVar15 + 1) = o_shared._24_8_;
    *(undefined2 *)((long)&uStack_287 + lVar15) = 0x300;
    puVar18 = auStack_281 + lVar15 + -4;
    puVar18[0] = 'e';
    puVar18[1] = 'x';
    puVar18[2] = 'p';
    puVar18[3] = '\0';
    *(undefined8 *)(auStack_261 + lVar15) = 0;
    *(undefined8 *)(auStack_259 + lVar15) = 0;
    *(undefined8 *)(auStack_251 + lVar15) = 0;
    *(undefined8 *)(auStack_249 + lVar15) = 0;
    *(undefined8 *)(auStack_281 + lVar15) = uVar6;
    *(undefined8 *)(auStack_279 + lVar15) = uVar7;
    *(undefined8 *)(auStack_271 + lVar15) = uVar8;
    *(undefined8 *)(auStack_269 + lVar15) = uVar9;
    uVar11 = o_dh._24_8_;
    uVar1 = o_dh._0_8_;
    uVar2 = o_dh._8_8_;
    uVar10 = o_dh._16_8_;
    *(undefined1 (*) [8])(auStack_241 + lVar15) = auStack_c8;
    *(undefined8 *)(auStack_239 + lVar15) = uVar1;
    *(undefined8 *)((long)&uStack_235 + lVar15 + 4) = uVar2;
    *(undefined8 *)((long)&uStack_22d + lVar15 + 4) = uVar10;
    *(undefined8 *)((long)&uStack_225 + lVar15 + 4) = uVar11;
    *(undefined8 *)((long)&local_21d + lVar15 + 4) = uVar3;
    *(undefined8 *)((long)&uStack_215 + lVar15 + 4) = uVar4;
    *(undefined8 *)((long)&uStack_20d + lVar15 + 4) = uVar5;
    *(undefined8 *)((long)&uStack_2a0 + lVar15) = 0x40;
    prklen = (uint32_t)*(undefined8 *)((long)&uStack_2a0 + lVar15);
    *(undefined8 *)((long)&uStack_2a0 + lVar15) = 0x1af741;
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_exporter,auStack_138,prklen,auStack_298 + lVar15,0x97,prklen);
    (auStack_338 + lVar15)[0] = '\0';
    (auStack_338 + lVar15)[1] = ' ';
    puVar18 = auStack_338 + lVar15 + 2;
    puVar18[0] = 'H';
    puVar18[1] = 'P';
    puVar18[2] = 'K';
    puVar18[3] = 'E';
    *(undefined2 *)((long)&uStack_332 + lVar15) = 0x762d;
    auStack_330[lVar15] = '1';
    *(undefined8 *)(auStack_330 + lVar15 + 1) = o_shared._24_8_;
    *(undefined2 *)((long)&uStack_327 + lVar15) = 0x300;
    puVar18 = auStack_321 + lVar15 + -4;
    puVar18[0] = 'k';
    puVar18[1] = 'e';
    puVar18[2] = 'y';
    puVar18[3] = '\0';
    *(undefined8 *)((long)auStack_301 + lVar15) = 0;
    *(undefined8 *)((long)auStack_301 + lVar15 + 8) = 0;
    *(undefined8 *)((long)auStack_301 + lVar15 + 0x10) = 0;
    *(undefined8 *)((long)auStack_301 + lVar15 + 0x18) = 0;
    *(undefined8 *)(auStack_321 + lVar15) = uVar6;
    *(undefined8 *)(auStack_319 + lVar15) = uVar7;
    *(undefined8 *)(auStack_311 + lVar15) = uVar8;
    *(undefined8 *)(auStack_309 + lVar15) = uVar9;
    uVar11 = o_dh._24_8_;
    uVar1 = o_dh._0_8_;
    uVar2 = o_dh._8_8_;
    uVar10 = o_dh._16_8_;
    *(undefined1 (*) [8])((long)auStack_301 + lVar15 + 0x20) = auStack_c8;
    *(undefined8 *)(auStack_2d9 + lVar15) = uVar1;
    *(undefined8 *)(auStack_2d1 + lVar15) = uVar2;
    *(undefined8 *)(auStack_2c9 + lVar15) = uVar10;
    *(undefined8 *)(auStack_2c1 + lVar15) = uVar11;
    *(undefined8 *)(auStack_2b9 + lVar15) = uVar3;
    *(undefined8 *)(auStack_2b1 + lVar15) = uVar4;
    *(undefined8 *)(auStack_2a9 + lVar15) = uVar5;
    puVar13 = auStack_342 + lVar15 + 2;
    puVar13[0] = ' ';
    puVar13[1] = '\0';
    puVar13[2] = '\0';
    puVar13[3] = '\0';
    puVar13[4] = '\0';
    puVar13[5] = '\0';
    puVar13[6] = '\0';
    puVar13[7] = '\0';
    uVar1 = *(undefined8 *)(auStack_342 + lVar15 + 2);
    puVar14 = auStack_342 + lVar15 + 2;
    puVar14[0] = 0xe8;
    puVar14[1] = 0xf7;
    puVar14[2] = '\x1a';
    puVar14[3] = '\0';
    puVar14[4] = '\0';
    puVar14[5] = '\0';
    puVar14[6] = '\0';
    puVar14[7] = '\0';
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_key,auStack_138,prklen,auStack_338 + lVar15,0x97,(uint32_t)uVar1);
    (auStack_3d8 + lVar15)[0] = '\0';
    (auStack_3d8 + lVar15)[1] = '\f';
    puVar18 = auStack_3d8 + lVar15 + 2;
    puVar18[0] = 'H';
    puVar18[1] = 'P';
    puVar18[2] = 'K';
    puVar18[3] = 'E';
    *(undefined2 *)((long)&uStack_3d2 + lVar15) = 0x762d;
    auStack_3d0[lVar15] = '1';
    *(undefined8 *)(auStack_3d0 + lVar15 + 1) = o_shared._24_8_;
    *(undefined2 *)((long)&uStack_3c7 + lVar15) = 0x300;
    *(undefined8 *)((long)&uStack_3c5 + lVar15) = 0x6e6f6e5f65736162;
    *(undefined2 *)((long)&uStack_3bd + lVar15) = 0x6563;
    auStack_3bb[lVar15] = '\0';
    *(undefined8 *)((long)auStack_39a + lVar15) = 0;
    *(undefined8 *)((long)auStack_39a + lVar15 + 8) = 0;
    *(undefined8 *)((long)auStack_39a + lVar15 + 0x10) = 0;
    *(undefined8 *)((long)auStack_39a + lVar15 + 0x18) = 0;
    *(undefined8 *)(auStack_3bb + lVar15 + 1) = uVar6;
    *(undefined8 *)(auStack_3b2 + lVar15) = uVar7;
    *(undefined8 *)(auStack_3aa + lVar15) = uVar8;
    *(undefined8 *)(auStack_3a2 + lVar15) = uVar9;
    uVar7 = o_dh._24_8_;
    uVar1 = o_dh._0_8_;
    uVar2 = o_dh._8_8_;
    uVar6 = o_dh._16_8_;
    *(undefined1 (*) [8])((long)auStack_39a + lVar15 + 0x20) = auStack_c8;
    *(undefined8 *)(auStack_372 + lVar15) = uVar1;
    *(undefined8 *)(auStack_36a + lVar15) = uVar2;
    *(undefined8 *)(auStack_362 + lVar15) = uVar6;
    *(undefined8 *)(auStack_35a + lVar15) = uVar7;
    *(undefined8 *)(auStack_352 + lVar15) = uVar3;
    *(undefined8 *)(auStack_34a + lVar15) = uVar4;
    *(undefined8 *)(auStack_342 + lVar15) = uVar5;
    *(undefined8 *)((long)&uStack_3e0 + lVar15) = 0xc;
    uVar1 = *(undefined8 *)((long)&uStack_3e0 + lVar15);
    *(undefined8 *)((long)&uStack_3e0 + lVar15) = 0x1af89b;
    Hacl_HKDF_expand_sha2_512
              (o_ctx.ctx_nonce,auStack_138,prklen,auStack_3d8 + lVar15,0x9e,(uint32_t)uVar1);
    *o_ctx.ctx_seq = 0;
  }
  return (uint)(bVar17 == 0xff);
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_51_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[129U] = { 0U };
    uint8_t o_secret[64U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 3U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[64U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[64U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 64U * sizeof (uint8_t));
    memcpy(o_context + 65U, o_info_hash, 64U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)64U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter, o_secret, 64U, tmp3, len3, 64U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key, o_secret, 64U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 158U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce, o_secret, 64U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}